

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase238::run(TestCase238 *this)

{
  Builder builder_00;
  Reader reader_00;
  ArrayPtr<capnp::word> AVar1;
  ArrayPtr<const_capnp::word> data;
  ReaderOptions options;
  undefined8 in_stack_ffffffffffff7cb0;
  undefined8 in_stack_ffffffffffff7cb8;
  Reader local_8318;
  ArrayPtr<capnp::word> local_82e8;
  ReaderOptions local_82d8;
  undefined1 local_82c0 [8];
  InputStreamMessageReader reader;
  undefined1 local_8178 [8];
  TestInputStream stream;
  word scratch [4096];
  Array<capnp::word> serialized;
  Builder local_130;
  undefined1 local_108 [8];
  TestMessageBuilder builder;
  TestCase238 *this_local;
  
  builder._240_8_ = this;
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_108,1);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_130,(MessageBuilder *)local_108);
  builder_00._builder.capTable = (CapTableBuilder *)local_130._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_130._builder.capTable;
  builder_00._builder.data = local_130._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_130._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_ffffffffffff7cb0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_ffffffffffff7cb0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_ffffffffffff7cb0 >> 0x30);
  initTestMessage(builder_00);
  messageToFlatArray((Array<capnp::word> *)(scratch + 0xfff),(MessageBuilder *)local_108);
  AVar1 = kj::Array<capnp::word>::asPtr((Array<capnp::word> *)(scratch + 0xfff));
  reader._288_8_ = AVar1.ptr;
  data = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&reader.unwindDetector);
  TestInputStream::TestInputStream((TestInputStream *)local_8178,data,false);
  local_82d8.traversalLimitInWords = 0;
  local_82d8.nestingLimit = 0;
  local_82d8._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_82d8);
  kj::ArrayPtr<capnp::word>::ArrayPtr(&local_82e8,(word *)&stream.lazy,0x1000);
  options.nestingLimit = local_82d8.nestingLimit;
  options.traversalLimitInWords = local_82d8.traversalLimitInWords;
  options._12_4_ = 0;
  InputStreamMessageReader::InputStreamMessageReader
            ((InputStreamMessageReader *)local_82c0,(InputStream *)local_8178,options,local_82e8);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_8318,(MessageReader *)local_82c0);
  reader_00._reader.capTable = (CapTableReader *)local_8318._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_8318._reader.capTable;
  reader_00._reader.data = local_8318._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_8318._reader._32_8_;
  reader_00._reader.dataSize = local_8318._reader.nestingLimit;
  reader_00._reader.pointerCount = local_8318._reader._44_2_;
  reader_00._reader._38_2_ = local_8318._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_ffffffffffff7cb8;
  checkTestMessage(reader_00);
  InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)local_82c0);
  TestInputStream::~TestInputStream((TestInputStream *)local_8178);
  kj::Array<capnp::word>::~Array((Array<capnp::word> *)(scratch + 0xfff));
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_108);
  return;
}

Assistant:

TEST(Orphans, OrphanageStructCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<TestAllTypes>();
  initTestMessage(root1);

  Orphan<TestAllTypes> orphan = builder2.getOrphanage().newOrphanCopy(root1.asReader());
  checkTestMessage(orphan.getReader());

  auto root2 = builder2.initRoot<TestAllTypes>();
  root2.adoptStructField(kj::mv(orphan));
}